

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DefaultRawMemoryAllocator.cpp
# Opt level: O2

void * __thiscall
Diligent::DefaultRawMemoryAllocator::AllocateAligned
          (DefaultRawMemoryAllocator *this,size_t Size,size_t Alignment,Char *dbgDescription,
          char *dbgFileName,Int32 dbgLineNumber)

{
  type tVar1;
  void *pvVar2;
  unsigned_long alignment;
  string msg;
  
  if (Size == 0 || Alignment == 0) {
    FormatString<char[26],char[26]>
              (&msg,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"Size > 0 && Alignment > 0",
               (char (*) [26])CONCAT71((int7)((ulong)dbgDescription >> 8),Alignment != 0));
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"AllocateAligned",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Common/src/DefaultRawMemoryAllocator.cpp"
               ,0x75);
    std::__cxx11::string::~string((string *)&msg);
  }
  alignment = 8;
  if (8 < Alignment) {
    alignment = Alignment;
  }
  tVar1 = AlignUp<unsigned_long,unsigned_long>(Size,alignment);
  pvVar2 = (void *)aligned_alloc(alignment,tVar1);
  return pvVar2;
}

Assistant:

void* DefaultRawMemoryAllocator::AllocateAligned(size_t Size, size_t Alignment, const Char* dbgDescription, const char* dbgFileName, const Int32 dbgLineNumber)
{
    VERIFY_EXPR(Size > 0 && Alignment > 0);
    // Alignment must be a power of two and a multiple of sizeof(void*))
    Alignment = std::max(Alignment, sizeof(void*));
    // Size must be an integral multiple of alignment,
    // or aligned_alloc will return null
    Size = AlignUp(Size, Alignment);
    return ALIGNED_MALLOC(Size, Alignment, dbgFileName, dbgLineNumber);
}